

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall Network::update(Network *this)

{
  pointer ppPVar1;
  pointer ppSVar2;
  pointer ppPVar3;
  pointer ppSVar4;
  
  ppPVar1 = (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar3 = (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppPVar3 != ppPVar1;
      ppPVar3 = ppPVar3 + 1) {
    (**(*ppPVar3)->_vptr_Population)();
  }
  ppSVar2 = (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar4 = (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppSVar4 != ppSVar2; ppSVar4 = ppSVar4 + 1) {
    (**(*ppSVar4)->_vptr_Synapse)();
  }
  return;
}

Assistant:

void Network::update() {
    for(Population* p : populations) {
        p->update();
    }
    for(Synapse* s : synapses) {
        s->update();
    }
}